

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_memprof.c
# Opt level: O3

void * memprof_allocf(void *ud,void *ptr,size_t osize,size_t nsize)

{
  int iVar1;
  void *pvVar2;
  uint uVar3;
  
  pvVar2 = (*memprof.orig_alloc.allocf)(ud,ptr,osize,nsize);
  if (nsize == 0) {
    uVar3 = 0xfffffff6;
    if (0xfffffff6 < (uint)(memprof.g)->vmstate) {
      uVar3 = (memprof.g)->vmstate;
    }
    (*memprof_writers[~uVar3])(&memprof,'\x02');
  }
  else {
    uVar3 = 0xfffffff6;
    if (0xfffffff6 < (uint)(memprof.g)->vmstate) {
      uVar3 = (memprof.g)->vmstate;
    }
    if (ptr == (void *)0x0) {
      (*memprof_writers[~uVar3])(&memprof,'\x01');
      osize = nsize;
      ptr = pvVar2;
    }
    else {
      (*memprof_writers[~uVar3])(&memprof,'\x03');
      lj_wbuf_addu64(&memprof.out,(uint64_t)ptr);
      lj_wbuf_addu64(&memprof.out,osize);
      osize = nsize;
      ptr = pvVar2;
    }
  }
  lj_wbuf_addu64(&memprof.out,(uint64_t)ptr);
  lj_wbuf_addu64(&memprof.out,osize);
  iVar1 = lj_wbuf_test_flag(&memprof.out,'\x02');
  if (iVar1 != 0) {
    memprof_allocf_cold_1();
  }
  return pvVar2;
}

Assistant:

static void *memprof_allocf(void *ud, void *ptr, size_t osize, size_t nsize)
{
  struct memprof *mp = &memprof;
  const struct alloc *oalloc = &mp->orig_alloc;
  struct lj_wbuf *out = &mp->out;
  void *nptr;

  lj_assertX(MPS_PROFILE == mp->state, "bad memprof profile state");
  lj_assertX(oalloc->allocf != memprof_allocf,
	     "unexpected memprof old alloc function");
  lj_assertX(oalloc->allocf != NULL,
	     "uninitialized memprof old alloc function");
  lj_assertX(ud == oalloc->state, "bad old memprof profile state");

  nptr = oalloc->allocf(ud, ptr, osize, nsize);

  if (nsize == 0) {
    memprof_write_caller(mp, AEVENT_FREE);
    lj_wbuf_addu64(out, (uintptr_t)ptr);
    lj_wbuf_addu64(out, (uint64_t)osize);
  } else if (ptr == NULL) {
    memprof_write_caller(mp, AEVENT_ALLOC);
    lj_wbuf_addu64(out, (uintptr_t)nptr);
    lj_wbuf_addu64(out, (uint64_t)nsize);
  } else {
    memprof_write_caller(mp, AEVENT_REALLOC);
    lj_wbuf_addu64(out, (uintptr_t)ptr);
    lj_wbuf_addu64(out, (uint64_t)osize);
    lj_wbuf_addu64(out, (uintptr_t)nptr);
    lj_wbuf_addu64(out, (uint64_t)nsize);
  }

  /* Deinstrument memprof if required. */
  if (LJ_UNLIKELY(lj_wbuf_test_flag(out, STREAM_STOP)))
    lj_memprof_stop(mainthread(mp->g));

  return nptr;
}